

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_dup64i_vec_mips(TCGContext_conflict3 *tcg_ctx,TCGv_vec r,uint64_t a)

{
  vec_gen_2_mips(tcg_ctx,INDEX_op_dupi_vec,
                 (uint)(byte)((undefined1 *)((long)&tcg_ctx->pool_cur + 2))[(long)r],3,
                 (TCGArg)(r + (long)&tcg_ctx->pool_cur),a);
  return;
}

Assistant:

void tcg_gen_dup64i_vec(TCGContext *tcg_ctx, TCGv_vec r, uint64_t a)
{
    if (TCG_TARGET_REG_BITS == 32 && a == deposit64(a, 32, 32, a)) {
        do_dupi_vec(tcg_ctx, r, MO_32, a);
    } else if (TCG_TARGET_REG_BITS == 64 || a == (uint64_t)(int32_t)a) {
        do_dupi_vec(tcg_ctx, r, MO_64, a);
    } else {
        TCGv_i64 c = tcg_const_i64(tcg_ctx, a);
        tcg_gen_dup_i64_vec(tcg_ctx, MO_64, r, c);
        tcg_temp_free_i64(tcg_ctx, c);
    }
}